

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_plats.cpp
# Opt level: O3

bool EV_DoPlat(int tag,line_t_conflict *line,EPlatType type,double height,double speed,int delay,
              int lip,int change)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  undefined1 uVar4;
  uint uVar5;
  DMovingFloor *this;
  bool bVar6;
  sector_t_conflict *this_00;
  vertex_t *spot;
  FSectorTagIterator itr;
  FSectorTagIterator local_58;
  char *local_50;
  ulong local_48;
  line_t_conflict *local_40;
  _func_int **local_38;
  
  local_40 = line;
  local_38 = (_func_int **)speed;
  if (tag == 0) {
    local_58.searchtag = -0x80000000;
    local_58.start = -1;
    if ((line != (line_t_conflict *)0x0) && (line->backsector != (sector_t_conflict *)0x0)) {
      local_58.start = (int)((ulong)((long)line->backsector - (long)sectors) >> 3) * 0x7a44c6b;
    }
    bVar6 = false;
    goto LAB_00437dfb;
  }
  bVar6 = false;
  if (type == platPerpetualRaise) {
LAB_00437da9:
    P_ActivateInStasis(tag);
  }
  else if (type == platToggle) {
    bVar6 = true;
    goto LAB_00437da9;
  }
  local_58.start = tagManager.TagHashFirst[tag & 0xff];
  local_58.searchtag = tag;
LAB_00437dfb:
  local_50 = "Floor";
  if (type == platDownWaitUpStay) {
    local_50 = "Platform";
  }
  local_48 = (ulong)type;
  do {
    do {
      uVar5 = FSectorTagIterator::Next(&local_58);
      if ((int)uVar5 < 0) {
        return bVar6;
      }
      this_00 = sectors + uVar5;
      bVar3 = sector_t::PlaneMoving(this_00,0);
    } while (bVar3);
    this = (DMovingFloor *)
           M_Malloc_Dbg(0x80,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                        ,0x1f9);
    DMovingFloor::DMovingFloor(this,this_00);
    (this->super_DMover).super_DSectorEffect.super_DThinker.super_DObject._vptr_DObject =
         (_func_int **)&PTR_StaticType_006fc550;
    *(EPlatType *)&this[1].super_DMover.super_DSectorEffect.super_DThinker.PrevThinker = type;
    *(undefined4 *)&this[1].super_DMover.super_DSectorEffect.super_DThinker.NextThinker = 0xffffffff
    ;
    *(int *)((long)&this[1].super_DMover.super_DSectorEffect.super_DThinker.NextThinker + 4) = tag;
    this[1].super_DMover.super_DSectorEffect.super_DThinker.super_DObject._vptr_DObject = local_38;
    *(int *)&this[1].super_DMover.super_DSectorEffect.super_DThinker.super_DObject.GCNext = delay;
    this[1].super_DMover.super_DSectorEffect.super_DThinker.super_DObject.Class =
         (PClass *)(this_00->floorplane).D;
    if (change != 0) {
      if ((local_40 != (line_t_conflict *)0x0) &&
         (iVar1 = local_40->sidedef[0]->sector->planes[0].Texture.texnum,
         iVar2 = this_00->planes[0].Texture.texnum, this_00->planes[0].Texture.texnum = iVar1,
         iVar2 != iVar1)) {
        sector_t::AdjustFloorClip((sector_t *)this_00);
      }
      if (change == 1) {
        this_00->special = 0;
        this_00->damagetype = (FName)0x0;
        this_00->damageamount = 0;
        this_00->damageinterval = 0;
        this_00->leakydamage = 0;
        this_00->Flags = this_00->Flags & 0xfffff84f;
      }
    }
    bVar6 = true;
  } while (platRaiseAndStayLockout < type);
  uVar4 = (*(code *)(&DAT_006051b4 + *(int *)(&DAT_006051b4 + local_48 * 4)))();
  return (bool)uVar4;
}

Assistant:

bool EV_DoPlat (int tag, line_t *line, DPlat::EPlatType type, double height,
				double speed, int delay, int lip, int change)
{
	DPlat *plat;
	int secnum;
	sector_t *sec;
	bool rtn = false;
	bool manual = false;
	double newheight = 0;
	vertex_t *spot;

	if (tag != 0)
	{
		//	Activate all <type> plats that are in_stasis
		switch (type)
		{
		case DPlat::platToggle:
			rtn = true;
		case DPlat::platPerpetualRaise:
			P_ActivateInStasis (tag);
			break;

		default:
			break;
		}
	}


	// [RH] If tag is zero, use the sector on the back side
	//		of the activating line (if any).
	FSectorTagIterator itr(tag, line);
	while ((secnum = itr.Next()) >= 0)
	{
		sec = &sectors[secnum];

		if (sec->PlaneMoving(sector_t::floor))
		{
			continue;
		}

		// Find lowest & highest floors around sector
		rtn = true;
		plat = new DPlat (sec);

		plat->m_Type = type;
		plat->m_Crush = -1;
		plat->m_Tag = tag;
		plat->m_Speed = speed;
		plat->m_Wait = delay;

		//jff 1/26/98 Avoid raise plat bouncing a head off a ceiling and then
		//going down forever -- default lower to plat height when triggered
		plat->m_Low = sec->floorplane.fD();

		if (change)
		{
			if (line)
				sec->SetTexture(sector_t::floor, line->sidedef[0]->sector->GetTexture(sector_t::floor));
			if (change == 1) sec->ClearSpecial();
		}

		switch (type)
		{
		case DPlat::platRaiseAndStay:
		case DPlat::platRaiseAndStayLockout:
			newheight = sec->FindNextHighestFloor (&spot);
			plat->m_High = sec->floorplane.PointToDist (spot, newheight);
			plat->m_Low = sec->floorplane.fD();
			plat->m_Status = DPlat::up;
			plat->PlayPlatSound ("Floor");
			sec->ClearSpecial();
			break;

		case DPlat::platUpByValue:
		case DPlat::platUpByValueStay:
			newheight = sec->floorplane.ZatPoint (sec->centerspot) + height;
			plat->m_High = sec->floorplane.PointToDist (sec->centerspot, newheight);
			plat->m_Low = sec->floorplane.fD();
			plat->m_Status = DPlat::up;
			plat->PlayPlatSound ("Floor");
			break;
		
		case DPlat::platDownByValue:
			newheight = sec->floorplane.ZatPoint (sec->centerspot) - height;
			plat->m_Low = sec->floorplane.PointToDist (sec->centerspot, newheight);
			plat->m_High = sec->floorplane.fD();
			plat->m_Status = DPlat::down;
			plat->PlayPlatSound ("Floor");
			break;

		case DPlat::platDownWaitUpStay:
		case DPlat::platDownWaitUpStayStone:
			newheight = sec->FindLowestFloorSurrounding (&spot) + lip;
			plat->m_Low = sec->floorplane.PointToDist (spot, newheight);

			if (plat->m_Low < sec->floorplane.fD())
				plat->m_Low = sec->floorplane.fD();

			plat->m_High = sec->floorplane.fD();
			plat->m_Status = DPlat::down;
			plat->PlayPlatSound (type == DPlat::platDownWaitUpStay ? "Platform" : "Floor");
			break;
		
		case DPlat::platUpNearestWaitDownStay:
			newheight = sec->FindNextHighestFloor (&spot);
			// Intentional fall-through

		case DPlat::platUpWaitDownStay:
			if (type == DPlat::platUpWaitDownStay)
			{
				newheight = sec->FindHighestFloorSurrounding (&spot);
			}
			plat->m_High = sec->floorplane.PointToDist (spot, newheight);
			plat->m_Low = sec->floorplane.fD();

			if (plat->m_High > sec->floorplane.fD())
				plat->m_High = sec->floorplane.fD();

			plat->m_Status = DPlat::up;
			plat->PlayPlatSound ("Platform");
			break;

		case DPlat::platPerpetualRaise:
			newheight = sec->FindLowestFloorSurrounding (&spot) + lip;
			plat->m_Low =  sec->floorplane.PointToDist (spot, newheight);

			if (plat->m_Low < sec->floorplane.fD())
				plat->m_Low = sec->floorplane.fD();

			newheight = sec->FindHighestFloorSurrounding (&spot);
			plat->m_High =  sec->floorplane.PointToDist (spot, newheight);

			if (plat->m_High > sec->floorplane.fD())
				plat->m_High = sec->floorplane.fD();

			plat->m_Status = pr_doplat() & 1 ? DPlat::up : DPlat::down;

			plat->PlayPlatSound ("Platform");
			break;

		case DPlat::platToggle:	//jff 3/14/98 add new type to support instant toggle
			plat->m_Crush = 10;	//jff 3/14/98 crush anything in the way

			// set up toggling between ceiling, floor inclusive
			newheight = sec->FindLowestCeilingPoint (&spot);
			plat->m_Low = sec->floorplane.PointToDist (spot, newheight);
			plat->m_High = sec->floorplane.fD();
			plat->m_Status = DPlat::down;
			SN_StartSequence (sec, CHAN_FLOOR, "Silence", 0);
			break;

		case DPlat::platDownToNearestFloor:
			newheight = sec->FindNextLowestFloor (&spot) + lip;
			plat->m_Low = sec->floorplane.PointToDist (spot, newheight);
			plat->m_Status = DPlat::down;
			plat->m_High = sec->floorplane.fD();
			plat->PlayPlatSound ("Platform");
			break;

		case DPlat::platDownToLowestCeiling:
			newheight = sec->FindLowestCeilingSurrounding (&spot);
		    plat->m_Low = sec->floorplane.PointToDist (spot, newheight);
			plat->m_High = sec->floorplane.fD();

			if (plat->m_Low < sec->floorplane.fD())
				plat->m_Low = sec->floorplane.fD();

			plat->m_Status = DPlat::down;
			plat->PlayPlatSound ("Platform");
			break;

		default:
			break;
		}
	}
	return rtn;
}